

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaDefragmentationContext_T::~VmaDefragmentationContext_T(VmaDefragmentationContext_T *this)

{
  size_t in_RDI;
  VmaBlockVector *vector;
  uint32_t i;
  VmaBlockVector *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  uint in_stack_fffffffffffffff4;
  
  if (*(long *)(in_RDI + 0x48) == 0) {
    for (in_stack_fffffffffffffff4 = 0; in_stack_fffffffffffffff4 < *(uint *)(in_RDI + 0x40);
        in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
      in_stack_ffffffffffffffe8 =
           *(VmaBlockVector **)(*(long *)(in_RDI + 0x50) + (ulong)in_stack_fffffffffffffff4 * 8);
      if (in_stack_ffffffffffffffe8 != (VmaBlockVector *)0x0) {
        VmaBlockVector::SetIncrementalSort(in_stack_ffffffffffffffe8,true);
      }
    }
  }
  else {
    VmaBlockVector::SetIncrementalSort(*(VmaBlockVector **)(in_RDI + 0x48),true);
  }
  if (*(long *)(in_RDI + 0x90) != 0) {
    if (*(int *)(in_RDI + 0x3c) == 2) {
      vma_delete_array<VmaDefragmentationContext_T::StateBalanced>
                ((VkAllocationCallbacks *)
                 CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                 (StateBalanced *)in_stack_ffffffffffffffe8,in_RDI);
    }
    else if (*(int *)(in_RDI + 0x3c) == 8) {
      vma_delete_array<VmaDefragmentationContext_T::StateExtensive>
                ((VkAllocationCallbacks *)
                 CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                 (StateExtensive *)in_stack_ffffffffffffffe8,in_RDI);
    }
  }
  VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::~VmaVector
            ((VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *)0x2f85b4
            );
  return;
}

Assistant:

VmaDefragmentationContext_T::~VmaDefragmentationContext_T()
{
    if (m_PoolBlockVector != VMA_NULL)
    {
        m_PoolBlockVector->SetIncrementalSort(true);
    }
    else
    {
        for (uint32_t i = 0; i < m_BlockVectorCount; ++i)
        {
            VmaBlockVector* vector = m_pBlockVectors[i];
            if (vector != VMA_NULL)
                vector->SetIncrementalSort(true);
        }
    }

    if (m_AlgorithmState)
    {
        switch (m_Algorithm)
        {
        case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_BALANCED_BIT:
            vma_delete_array(m_MoveAllocator.m_pCallbacks, reinterpret_cast<StateBalanced*>(m_AlgorithmState), m_BlockVectorCount);
            break;
        case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_EXTENSIVE_BIT:
            vma_delete_array(m_MoveAllocator.m_pCallbacks, reinterpret_cast<StateExtensive*>(m_AlgorithmState), m_BlockVectorCount);
            break;
        default:
            VMA_ASSERT(0);
        }
    }
}